

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_invokespecial(ExecutionEngine *this)

{
  byte bVar1;
  u2 index;
  cp_info *constantPool;
  anon_union_8_10_52016fac_for_data object;
  ushort uVar2;
  int iVar3;
  Frame *this_00;
  cp_info **ppcVar4;
  u1 *puVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  MethodArea *this_01;
  ClassRuntime *classRuntime;
  Frame *this_02;
  Frame *pFVar9;
  ostream *poVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  Value objectValue;
  vector<Value,_std::allocator<Value>_> args;
  string methodName;
  string className;
  string methodDescriptor;
  stack<Value,_std::deque<Value,_std::allocator<Value>_>_> operandStackBackup;
  Value local_1b8;
  vector<Value,_std::allocator<Value>_> local_1a8;
  VMStack *local_190;
  char *local_188;
  long local_180;
  char local_178 [16];
  string local_168;
  undefined1 *local_148;
  long local_140;
  undefined1 local_138 [16];
  vector<Value,_std::allocator<Value>_> local_128;
  string local_110;
  string local_f0;
  _Deque_base<Value,_std::allocator<Value>_> local_d0;
  _Deque_base<Value,_std::allocator<Value>_> local_80;
  
  local_190 = VMStack::getInstance();
  this_00 = VMStack::getTopFrame(local_190);
  Frame::backupOperandStack
            ((stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&local_80,this_00);
  ppcVar4 = Frame::getConstantPool(this_00);
  constantPool = *ppcVar4;
  puVar5 = Frame::getCode(this_00,this_00->pc);
  uVar6 = (ulong)(ushort)(*(ushort *)(puVar5 + 1) << 8 | *(ushort *)(puVar5 + 1) >> 8);
  if (constantPool[uVar6 - 1].tag != '\n') {
    __assert_fail("methodCP.tag == CONSTANT_Methodref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xfad,"void ExecutionEngine::i_invokespecial()");
  }
  uVar13 = (ulong)constantPool[uVar6 - 1].info.fieldref_info.name_and_type_index;
  pcVar7 = getFormattedConstant(constantPool,constantPool[uVar6 - 1].info.fieldref_info.class_index)
  ;
  std::__cxx11::string::string((string *)&local_168,pcVar7,(allocator *)&local_188);
  if (constantPool[uVar13 - 1].tag != '\f') {
    __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xfb4,"void ExecutionEngine::i_invokespecial()");
  }
  index = constantPool[uVar13 - 1].info.fieldref_info.name_and_type_index;
  pcVar7 = getFormattedConstant
                     (constantPool,constantPool[uVar13 - 1].info.fieldref_info.class_index);
  std::__cxx11::string::string((string *)&local_188,pcVar7,(allocator *)&local_148);
  pcVar7 = getFormattedConstant(constantPool,index);
  std::__cxx11::string::string((string *)&local_148,pcVar7,(allocator *)&local_1a8);
  iVar3 = std::__cxx11::string::compare((char *)&local_168);
  if (((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)&local_168), iVar3 != 0)) ||
     (iVar3 = std::__cxx11::string::compare((char *)&local_188), iVar3 != 0)) {
    lVar8 = std::__cxx11::string::find((char *)&local_168,0x127561,0);
    if (lVar8 != -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Tentando invocar metodo especial invalido: ",0x2b);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_188,local_180);
      std::endl<char,std::char_traits<char>>(poVar10);
      exit(1);
    }
    uVar11 = 1;
    uVar2 = 0;
    do {
      bVar1 = local_148[uVar11];
      if (bVar1 < 0x4c) {
        if ((bVar1 == 0x44) || (bVar1 == 0x4a)) {
          uVar2 = uVar2 + 2;
        }
        else {
          if (bVar1 == 0x29) goto LAB_0011fd2f;
LAB_0011fd29:
          uVar2 = uVar2 + 1;
        }
      }
      else {
        if (bVar1 != 0x5b) {
          if (bVar1 == 0x4c) {
            do {
              uVar11 = uVar11 + 1;
            } while (local_148[uVar11] != ';');
          }
          goto LAB_0011fd29;
        }
        uVar2 = uVar2 + 1;
        do {
          uVar11 = uVar11 + 1;
        } while (local_148[uVar11] == '[');
        if (local_148[uVar11] == 'L') {
          do {
            uVar11 = uVar11 + 1;
          } while (local_148[uVar11] != ';');
        }
      }
      uVar11 = uVar11 + 1;
    } while( true );
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_168);
  if (iVar3 == 0) {
    Frame::popTopOfOperandStack(this_00);
  }
LAB_0011ff61:
  this_00->pc = this_00->pc + 3;
LAB_0011ff64:
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  std::_Deque_base<Value,_std::allocator<Value>_>::~_Deque_base(&local_80);
  return;
LAB_0011fd2f:
  local_1a8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (Value *)0x0;
  local_1a8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (uVar2 != 0) {
    uVar12 = (uint)uVar2;
    do {
      local_1b8 = Frame::popTopOfOperandStack(this_00);
      if ((local_1b8._0_8_ & 0xffffffff00000000) == 0xa00000000) {
        std::vector<Value,_std::allocator<Value>_>::insert
                  (&local_1a8,
                   local_1a8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                   super__Vector_impl_data._M_start + 1,&local_1b8);
      }
      else {
        std::vector<Value,_std::allocator<Value>_>::insert
                  (&local_1a8,
                   (const_iterator)
                   local_1a8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_1b8);
      }
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  local_1b8 = Frame::popTopOfOperandStack(this_00);
  if ((local_1b8._0_8_ & 0xffffffff00000000) != 0x900000000) {
    __assert_fail("objectValue.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xfe8,"void ExecutionEngine::i_invokespecial()");
  }
  std::vector<Value,_std::allocator<Value>_>::insert
            (&local_1a8,
             (const_iterator)
             local_1a8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
             super__Vector_impl_data._M_start,&local_1b8);
  object.longValue = local_1b8.data.longValue;
  iVar3 = (**(local_1b8.data.object)->_vptr_Object)(local_1b8.data.longValue);
  if (iVar3 != 0) {
    __assert_fail("object->objectType() == ObjectType::CLASS_INSTANCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xfec,"void ExecutionEngine::i_invokespecial()");
  }
  this_01 = MethodArea::getInstance();
  classRuntime = MethodArea::loadClassNamed(this_01,&local_168);
  this_02 = (Frame *)operator_new(0xb8);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_188,local_188 + local_180);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_148,local_148 + local_140);
  std::vector<Value,_std::allocator<Value>_>::vector(&local_128,&local_1a8);
  Frame::Frame(this_02,(ClassInstance *)object.object,classRuntime,&local_f0,&local_110,&local_128);
  if (local_128.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  pFVar9 = VMStack::getTopFrame(local_190);
  if (pFVar9 == this_00) {
    VMStack::addFrame(local_190,this_02);
  }
  else {
    std::deque<Value,_std::allocator<Value>_>::deque
              ((deque<Value,_std::allocator<Value>_> *)&local_d0,
               (deque<Value,_std::allocator<Value>_> *)&local_80);
    Frame::setOperandStackFromBackup
              (this_00,(stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&local_d0);
    std::_Deque_base<Value,_std::allocator<Value>_>::~_Deque_base(&local_d0);
    Frame::~Frame(this_02);
    operator_delete(this_02);
  }
  if (local_1a8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_start != (Value *)0x0) {
    operator_delete(local_1a8.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pFVar9 != this_00) goto LAB_0011ff64;
  goto LAB_0011ff61;
}

Assistant:

void ExecutionEngine::i_invokespecial() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    stack<Value> operandStackBackup = topFrame->backupOperandStack();
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t methodIndex = (byte1 << 8) | byte2;
    cp_info methodCP = constantPool[methodIndex-1];
    assert(methodCP.tag == CONSTANT_Methodref); // precisa referenciar um método

    CONSTANT_Methodref_info methodInfo = methodCP.info.methodref_info;

    string className = getFormattedConstant(constantPool, methodInfo.class_index);

    cp_info nameAndTypeCP = constantPool[methodInfo.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info methodNameAndType = nameAndTypeCP.info.nameAndType_info;

    string methodName = getFormattedConstant(constantPool, methodNameAndType.name_index);
    string methodDescriptor = getFormattedConstant(constantPool, methodNameAndType.descriptor_index);
    
    // casos especiais
    if ((className == "java/lang/Object" || className == "java/lang/String") && methodName == "<init>") {
        if (className == "java/lang/String") {
            topFrame->popTopOfOperandStack();
        }
        
        topFrame->pc += 3;
        return;
    }
    // fim dos casos especiais
    
    if (className.find("java/") != string::npos) {
        cerr << "Tentando invocar metodo especial invalido: " << methodName << endl;
        exit(1);
    } else {
        uint16_t nargs = 0; // numero de argumentos contidos na pilha de operandos
        uint16_t i = 1; // pulando o primeiro '('
        while (methodDescriptor[i] != ')') {
            char baseType = methodDescriptor[i];
            if (baseType == 'D' || baseType == 'J') {
                nargs += 2;
            } else if (baseType == 'L') {
                nargs++;
                while (methodDescriptor[++i] != ';');
            } else if (baseType == '[') {
                nargs++;
                while (methodDescriptor[++i] == '[');
                if (methodDescriptor[i] == 'L') while (methodDescriptor[++i] != ';');
            } else {
                nargs++;
            }
            i++;
        }

        vector<Value> args;
        for (int i = 0; i < nargs; i++) {
            Value value = topFrame->popTopOfOperandStack();
            if (value.type == ValueType::PADDING) {
                args.insert(args.begin() + 1, value); // adicionando o padding após o valor double/long.
            } else {
                args.insert(args.begin(), value);
            }
        }

        Value objectValue = topFrame->popTopOfOperandStack();
        assert(objectValue.type == ValueType::REFERENCE); // necessita ser uma referência para objeto
        args.insert(args.begin(), objectValue);

        Object *object = objectValue.data.object;
        assert(object->objectType() == ObjectType::CLASS_INSTANCE); // objeto precisa ser uma instância
        ClassInstance *instance = (ClassInstance *) object;

        MethodArea &methodArea = MethodArea::getInstance();
        ClassRuntime *classRuntime = methodArea.loadClassNamed(className);
        
        Frame *newFrame = new Frame(instance, classRuntime, methodName, methodDescriptor, args);

        // se a stack frame mudou, é porque teve <clinit> adicionado, então terminar a execução da instrução para eles serem executados.
        if (stackFrame.getTopFrame() != topFrame) {
            topFrame->setOperandStackFromBackup(operandStackBackup);
            delete newFrame;
            return;
        }

        stackFrame.addFrame(newFrame);
    }

    topFrame->pc += 3;
}